

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

SVSetBase<double> * __thiscall
soplex::SVSetBase<double>::operator=(SVSetBase<double> *this,SVSetBase<double> *rhs)

{
  int iVar1;
  ClassArray<soplex::Nonzero<double>_> *this_00;
  SVSetBase<double> *in_RSI;
  SVSetBase<double> *in_RDI;
  ptrdiff_t delta;
  void *delta1;
  void *delta0;
  DLPSV *newps;
  DLPSV *ps;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  SVSetBase<double> *in_stack_ffffffffffffffa0;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *this_01;
  ClassArray<soplex::Nonzero<double>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *in_stack_ffffffffffffffb8;
  DLPSV *local_18;
  
  if (in_RDI != in_RSI) {
    ClassArray<soplex::Nonzero<double>_>::size(&in_RSI->super_ClassArray<soplex::Nonzero<double>_>);
    clear(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    iVar1 = ClassArray<soplex::Nonzero<double>_>::size
                      (&in_RSI->super_ClassArray<soplex::Nonzero<double>_>);
    if (0 < iVar1) {
      ClassArray<soplex::Nonzero<double>_>::operator=
                ((ClassArray<soplex::Nonzero<double>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
      ClassSet<soplex::SVSetBase<double>::DLPSV>::operator=
                ((ClassSet<soplex::SVSetBase<double>::DLPSV> *)in_RDI,in_stack_ffffffffffffffb8);
      ClassArray<soplex::Nonzero<double>_>::operator[]
                (&in_RDI->super_ClassArray<soplex::Nonzero<double>_>,0);
      ClassArray<soplex::Nonzero<double>_>::operator[]
                (&in_RSI->super_ClassArray<soplex::Nonzero<double>_>,0);
      local_18 = IdList<soplex::SVSetBase<double>::DLPSV>::first(&in_RSI->list);
      while (local_18 != (DLPSV *)0x0) {
        this_01 = &in_RDI->set;
        iVar1 = number((SVSetBase<double> *)this_01,
                       (SVectorBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        this_00 = (ClassArray<soplex::Nonzero<double>_> *)
                  ClassSet<soplex::SVSetBase<double>::DLPSV>::operator[](this_01,iVar1);
        IdList<soplex::SVSetBase<double>::DLPSV>::append
                  ((IdList<soplex::SVSetBase<double>::DLPSV> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (DLPSV *)in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffa8 = this_00;
        in_stack_ffffffffffffffb4 = SVectorBase<double>::max(&local_18->super_SVectorBase<double>);
        SVectorBase<double>::mem(&local_18->super_SVectorBase<double>);
        SVectorBase<double>::setMem
                  ((SVectorBase<double> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(Nonzero<double> *)this_01);
        iVar1 = SVectorBase<double>::size(&local_18->super_SVectorBase<double>);
        SVectorBase<double>::set_size((SVectorBase<double> *)this_00,iVar1);
        local_18 = IdList<soplex::SVSetBase<double>::DLPSV>::next
                             ((IdList<soplex::SVSetBase<double>::DLPSV> *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (DLPSV *)in_stack_ffffffffffffffa8);
      }
    }
  }
  return in_RDI;
}

Assistant:

SVSetBase<R>& operator=(const SVSetBase<R>& rhs)
   {
      if(this != &rhs)
      {
         clear(rhs.size());

         if(rhs.size() > 0)
         {
            SVSetBaseArray::operator=(rhs);
            set = rhs.set;

            DLPSV* ps;
            DLPSV* newps;

            void* delta0 = &(*(static_cast<SVSetBaseArray*>(this)))[0];
            void* delta1 = &(*(static_cast<SVSetBaseArray*>(const_cast<SVSetBase<R>*>(&rhs))))[0];
            ptrdiff_t delta = reinterpret_cast<char*>(delta0) - reinterpret_cast<char*>(delta1);

            for(ps = rhs.list.first(); ps; ps = rhs.list.next(ps))
            {
               newps = &set[rhs.number(ps)];
               list.append(newps);
               newps->setMem(ps->max(),
                             reinterpret_cast<Nonzero<R>*>(reinterpret_cast<char*>(ps->mem()) + delta));
               newps->set_size(ps->size());
            }
         }
      }

      assert(isConsistent());

      return *this;
   }